

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O1

RK_S32 __thiscall
VpuApiLegacy::encoder_sendframe
          (VpuApiLegacy *this,VpuCodecContext *ctx,EncInputStream_t *aEncInStrm)

{
  RK_U32 width;
  uint uVar1;
  RK_S64 RVar2;
  VpuApiLegacy *pVVar3;
  MPP_RET MVar4;
  uint uVar5;
  int iVar6;
  RK_U8 *dst;
  MppMeta meta;
  uint uVar7;
  MppFrameFormat MVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  MppFrame frame;
  ulong local_80;
  ulong local_78;
  MppBuffer buffer;
  ulong local_68;
  VpuApiLegacy *local_60;
  MppBufferInfo inputCommit;
  
  local_60 = this;
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","encoder_sendframe");
  }
  width = ctx->width;
  uVar5 = ctx->height;
  RVar2 = aEncInStrm->timeUs;
  local_68 = (ulong)(uint)aEncInStrm->size;
  uVar1 = aEncInStrm->bufPhyAddr;
  frame = (MppFrame)0x0;
  MVar4 = mpp_frame_init();
  if (MVar4 != MPP_OK) {
    _mpp_log_l(2,"vpu_api_legacy","mpp_frame_init failed\n","encoder_sendframe");
    goto LAB_001085d4;
  }
  uVar7 = width + 0xf & 0xfffffff0;
  uVar10 = uVar5 + 7 & 0xfffffff8;
  local_78 = (ulong)uVar1;
  mpp_frame_set_width(frame,width);
  local_80 = (ulong)uVar5;
  mpp_frame_set_height(frame,uVar5);
  mpp_frame_set_ver_stride(frame,uVar10);
  mpp_frame_set_pts(frame,RVar2);
  pVVar3 = local_60;
  uVar9 = local_68;
  MVar8 = local_60->format & 0xfffff;
  uVar5 = MVar8 - MPP_FMT_RGB565;
  if (uVar5 < 0xe) {
    if ((0xfU >> (uVar5 & 0x1f) & 1) == 0) {
      if ((0x3c00U >> (uVar5 & 0x1f) & 1) == 0) {
        if ((0xc0U >> (uVar5 & 0x1f) & 1) == 0) goto LAB_001086c8;
        uVar5 = uVar7 * 3;
      }
      else {
        uVar5 = uVar7 * 4;
      }
    }
    else {
      uVar5 = uVar7 * 2;
    }
LAB_001086e7:
    mpp_frame_set_hor_stride(frame,uVar5);
  }
  else {
LAB_001086c8:
    if ((MVar8 < MPP_FMT_YUV422P) &&
       (uVar5 = uVar7, (0x31U >> (local_60->format & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0))
    goto LAB_001086e7;
    _mpp_log_l(2,"vpu_api_legacy","unsupport format 0x%x\n",0);
  }
  mpp_frame_set_fmt(frame,pVVar3->format & 0xfffff);
  if (aEncInStrm->nFlags != 0) {
    _mpp_log_l(4,"vpu_api_legacy","found eos true\n","encoder_sendframe");
    mpp_frame_set_eos(frame,1);
  }
  if (uVar9 == 0) {
    mpp_frame_set_buffer(frame,0);
    if (aEncInStrm->nFlags == 0) {
      _mpp_log_l(2,"vpu_api_legacy","found empty frame without eos flag set!\n","encoder_sendframe")
      ;
    }
  }
  else {
    if (pVVar3->fd_input < 0) {
      iVar6 = is_valid_dma_fd((int)local_78);
      pVVar3->fd_input = iVar6;
    }
    if (pVVar3->fd_input == 0) {
      if (aEncInStrm->buf == (RK_U8 *)0x0) {
        MVar4 = MPP_ERR_NULL_PTR;
LAB_00108903:
        bVar11 = false;
      }
      else {
        MVar8 = pVVar3->format;
        if ((MVar8 < MPP_FMT_YUV_BUTT) || (MVar8 - MPP_FMT_YUV420SP_VU < 0xf)) {
          uVar5 = uVar7 * (uVar10 + 0xf & 0xfffffff0) * 3 >> 1;
        }
        else if (MVar8 - MPP_FMT_RGB565 < 7) {
          uVar5 = uVar7 * (uVar10 + 0xf & 0xfffffff0) * 3;
        }
        else {
          if ((MVar8 & ~MPP_FMT_YUV422SP_VU) != MPP_FMT_RGB101010) {
            _mpp_log_l(2,"vpu_api_legacy","unsupport input format:%d\n","encoder_sendframe");
            MVar4 = MPP_NOK;
            goto LAB_00108903;
          }
          uVar5 = uVar7 * (uVar10 + 0xf & 0x3ffffff0) * 4;
        }
        if (uVar5 == 0) {
          bVar11 = true;
          MVar4 = MPP_OK;
        }
        else {
          inputCommit.type = MPP_BUFFER_TYPE_NORMAL;
          inputCommit._4_4_ = 0;
          MVar4 = mpp_buffer_get_with_tag
                            (pVVar3->memGroup,&inputCommit,uVar5,"vpu_api_legacy",
                             "encoder_sendframe",local_80);
          bVar11 = MVar4 == MPP_OK;
          if (bVar11) {
            dst = (RK_U8 *)mpp_buffer_get_ptr_with_caller(inputCommit._0_8_,"encoder_sendframe");
            copy_align_raw_buffer_to_dest(dst,aEncInStrm->buf,width,(RK_U32)local_80,pVVar3->format)
            ;
            mpp_frame_set_buffer(frame,inputCommit._0_8_);
            mpp_buffer_put_with_caller(inputCommit._0_8_,"encoder_sendframe");
            inputCommit.type = MPP_BUFFER_TYPE_NORMAL;
            inputCommit._4_4_ = 0;
          }
          else {
            _mpp_log_l(2,"vpu_api_legacy","allocate input picture buffer failed\n",
                       "encoder_sendframe");
          }
        }
      }
      uVar9 = local_68;
      if (!bVar11) goto LAB_001085d4;
    }
    else {
      inputCommit.ptr = (void *)0x0;
      inputCommit.hnd = (void *)0x0;
      inputCommit.type = MPP_BUFFER_TYPE_ION;
      inputCommit._4_4_ = 0;
      inputCommit.size = uVar9;
      inputCommit._32_8_ = local_78 & 0xffffffff;
      buffer = (MppBuffer)0x0;
      MVar4 = mpp_buffer_import_with_tag
                        (0,&inputCommit,&buffer,"vpu_api_legacy","encoder_sendframe");
      if (MVar4 != MPP_OK) {
        _mpp_log_l(2,"vpu_api_legacy","import input picture buffer failed\n","encoder_sendframe");
        goto LAB_001085d4;
      }
      mpp_frame_set_buffer(frame,buffer);
      mpp_buffer_put_with_caller(buffer,"encoder_sendframe");
      buffer = (MppBuffer)0x0;
    }
  }
  if (((byte)vpu_api_debug & 0x10) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","w %d h %d input fd %d size %d pts %lld, flag %d \n",
               "encoder_sendframe",width,local_80,local_78,uVar9,aEncInStrm->timeUs,
               aEncInStrm->nFlags);
  }
  if (pVVar3->mlvec != (VpuApiMlvec)0x0) {
    meta = (MppMeta)mpp_frame_get_meta(frame);
    vpu_api_mlvec_set_dy_cfg(pVVar3->mlvec,&pVVar3->mlvec_dy_cfg,meta);
  }
  MVar4 = (*pVVar3->mpi->encode_put_frame)(pVVar3->mpp_ctx,frame);
  if (MVar4 == MPP_OK) {
    aEncInStrm->size = 0;
    MVar4 = MPP_OK;
  }
  else {
    _mpp_log_l(2,"vpu_api_legacy","encode_put_frame ret %d\n","encoder_sendframe",MVar4);
  }
LAB_001085d4:
  if (frame != (MppFrame)0x0) {
    mpp_frame_deinit(&frame);
  }
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","leave ret %d\n","encoder_sendframe",MVar4);
  }
  return MVar4;
}

Assistant:

RK_S32 VpuApiLegacy::encoder_sendframe(VpuCodecContext *ctx, EncInputStream_t *aEncInStrm)
{
    RK_S32 ret = 0;
    vpu_api_dbg_func("enter\n");

    RK_U32 width        = ctx->width;
    RK_U32 height       = ctx->height;
    RK_U32 hor_stride   = MPP_ALIGN(width,  16);
    RK_U32 ver_stride   = MPP_ALIGN(height, 8);
    RK_S64 pts          = aEncInStrm->timeUs;
    RK_S32 fd           = aEncInStrm->bufPhyAddr;
    RK_U32 size         = aEncInStrm->size;

    /* try import input buffer and output buffer */
    MppFrame frame = NULL;

    ret = mpp_frame_init(&frame);
    if (MPP_OK != ret) {
        mpp_err_f("mpp_frame_init failed\n");
        goto FUNC_RET;
    }

    mpp_frame_set_width(frame, width);
    mpp_frame_set_height(frame, height);
    mpp_frame_set_ver_stride(frame, ver_stride);
    mpp_frame_set_pts(frame, pts);
    switch (format & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420P :
    case MPP_FMT_YUV420SP :
    case MPP_FMT_YUV420SP_VU : {
        mpp_frame_set_hor_stride(frame, hor_stride);
    } break;
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555: {
        mpp_frame_set_hor_stride(frame, hor_stride * 2);
    } break;
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        mpp_frame_set_hor_stride(frame, hor_stride * 3);
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        mpp_frame_set_hor_stride(frame, hor_stride * 4);
    } break;
    default: {
        mpp_err("unsupport format 0x%x\n", format & MPP_FRAME_FMT_MASK);
    } break;
    }
    mpp_frame_set_fmt(frame, (MppFrameFormat)(format & MPP_FRAME_FMT_MASK));
    if (aEncInStrm->nFlags) {
        mpp_log_f("found eos true\n");
        mpp_frame_set_eos(frame, 1);
    }

    if (size <= 0) {
        mpp_frame_set_buffer(frame, NULL);
        if (!aEncInStrm->nFlags)
            mpp_err_f("found empty frame without eos flag set!\n");
        goto PUT_FRAME;
    }

    if (fd_input < 0) {
        fd_input = is_valid_dma_fd(fd);
    }
    if (fd_input) {
        MppBufferInfo   inputCommit;

        memset(&inputCommit, 0, sizeof(inputCommit));
        inputCommit.type = MPP_BUFFER_TYPE_ION;
        inputCommit.size = size;
        inputCommit.fd = fd;
        if (size > 0) {
            MppBuffer buffer = NULL;
            ret = mpp_buffer_import(&buffer, &inputCommit);
            if (ret) {
                mpp_err_f("import input picture buffer failed\n");
                goto FUNC_RET;
            }
            mpp_frame_set_buffer(frame, buffer);
            mpp_buffer_put(buffer);
            buffer = NULL;
        }
    } else {
        RK_U32 align_size   = 0;

        if (NULL == aEncInStrm->buf) {
            ret = MPP_ERR_NULL_PTR;
            goto FUNC_RET;
        }
        if (format >= MPP_FMT_YUV420SP && format < MPP_FMT_YUV_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3 / 2;
        } else  if (format >= MPP_FMT_YUV420SP_VU && format < MPP_FMT_YUV_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3 / 2;
        } else if (format >= MPP_FMT_RGB565 && format < MPP_FMT_BGR888) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3;
        } else if (format >= MPP_FMT_RGB101010 && format < MPP_FMT_RGB_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 4;
        } else {
            mpp_err_f("unsupport input format:%d\n", format);
            ret = MPP_NOK;
            goto FUNC_RET;
        }
        if (align_size > 0) {
            MppBuffer buffer = NULL;
            ret = mpp_buffer_get(memGroup, &buffer, align_size);
            if (ret) {
                mpp_err_f("allocate input picture buffer failed\n");
                goto FUNC_RET;
            }
            copy_align_raw_buffer_to_dest((RK_U8 *)mpp_buffer_get_ptr(buffer),
                                          aEncInStrm->buf, width, height, format);
            mpp_frame_set_buffer(frame, buffer);
            mpp_buffer_put(buffer);
            buffer = NULL;
        }
    }

PUT_FRAME:

    vpu_api_dbg_input("w %d h %d input fd %d size %d pts %lld, flag %d \n",
                      width, height, fd, size, aEncInStrm->timeUs, aEncInStrm->nFlags);
    if (mlvec) {
        MppMeta meta = mpp_frame_get_meta(frame);

        vpu_api_mlvec_set_dy_cfg(mlvec, &mlvec_dy_cfg, meta);
    }

    ret = mpi->encode_put_frame(mpp_ctx, frame);
    if (ret)
        mpp_err_f("encode_put_frame ret %d\n", ret);
    else
        aEncInStrm->size = 0;

FUNC_RET:
    if (frame)
        mpp_frame_deinit(&frame);

    vpu_api_dbg_func("leave ret %d\n", ret);
    return ret;
}